

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnRethrow(TypeChecker *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Label *label;
  Label *local_10;
  
  RVar1 = GetRethrowLabel(this,depth,&local_10);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = SetUnreachable(this);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::OnRethrow(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetRethrowLabel(depth, &label));
  CHECK_RESULT(SetUnreachable());
  return result;
}